

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MultiValuesEnd(Parse *pParse,Select *pVal)

{
  Vdbe *in_RSI;
  SrcItem *pItem;
  int regYield;
  
  if (((in_RSI != (Vdbe *)0x0) && (0 < **(int **)&in_RSI->nCursor)) &&
     ((*(ushort *)(*(long *)&in_RSI->nCursor + 0x21) >> 2 & 1) != 0)) {
    regYield = (int)((ulong)(*(long *)&in_RSI->nCursor + 8) >> 0x20);
    sqlite3VdbeEndCoroutine(in_RSI,regYield);
    sqlite3VdbeJumpHere(in_RSI,regYield);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MultiValuesEnd(Parse *pParse, Select *pVal){
  if( ALWAYS(pVal) && pVal->pSrc->nSrc>0 ){
    SrcItem *pItem = &pVal->pSrc->a[0];
    assert( (pItem->fg.isSubquery && pItem->u4.pSubq!=0) || pParse->nErr );
    if( pItem->fg.isSubquery ){
      sqlite3VdbeEndCoroutine(pParse->pVdbe, pItem->u4.pSubq->regReturn);
      sqlite3VdbeJumpHere(pParse->pVdbe, pItem->u4.pSubq->addrFillSub - 1);
    }
  }
}